

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>::
~ArrayBuilder(ArrayBuilder<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
              *this)

{
  Located<capnp::Text::Reader> *pLVar1;
  RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pRVar2;
  Located<capnp::Text::Reader> *pLVar3;
  
  pLVar1 = this->ptr;
  if (pLVar1 != (Located<capnp::Text::Reader> *)0x0) {
    pRVar2 = this->pos;
    pLVar3 = this->endPtr;
    this->ptr = (Located<capnp::Text::Reader> *)0x0;
    this->pos = (RemoveConst<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>
                 *)0x0;
    this->endPtr = (Located<capnp::Text::Reader> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pLVar1,0x18,((long)pRVar2 - (long)pLVar1 >> 3) * -0x5555555555555555,
               ((long)pLVar3 - (long)pLVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }